

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

bson_t * bson_new(void)

{
  bson_t *pbVar1;
  
  pbVar1 = (bson_t *)bson_malloc(0x80);
  pbVar1->flags = 1;
  pbVar1->len = 5;
  pbVar1->padding[0] = '\x05';
  pbVar1->padding[1] = '\0';
  pbVar1->padding[2] = '\0';
  pbVar1->padding[3] = '\0';
  pbVar1->padding[4] = '\0';
  return pbVar1;
}

Assistant:

bson_t *
bson_new (void)
{
   bson_impl_inline_t *impl;
   bson_t *bson;

   bson = bson_malloc (sizeof *bson);

   impl = (bson_impl_inline_t *) bson;
   impl->flags = BSON_FLAG_INLINE;
   impl->len = 5;
   impl->data[0] = 5;
   impl->data[1] = 0;
   impl->data[2] = 0;
   impl->data[3] = 0;
   impl->data[4] = 0;

   return bson;
}